

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_study.c
# Opt level: O2

int coda__pcre2_study_8(pcre2_real_code_8 *re)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  uint8_t *puVar12;
  uint uVar13;
  uint uVar14;
  int *in_R8;
  uint8_t *code;
  int count;
  int depth;
  
  count = 0;
  uVar13 = re->overall_options & 0x80000;
  lVar9 = (ulong)re->name_count * (ulong)re->name_entry_size;
  code = re[1].start_bitmap + lVar9 + -0x28;
  uVar11 = re->flags;
  if ((uVar11 & 0x210) == 0) {
    depth = 0;
    iVar3 = set_start_bits(re,code,(BOOL)&depth,(BOOL)lVar9,in_R8);
    if (iVar3 == 1) {
      puVar12 = re->start_bitmap;
      uVar14 = 0;
      uVar10 = 0xffffffffffffffff;
      uVar11 = 7;
      uVar5 = 0xffffffff;
      while( true ) {
        uVar4 = (uint)uVar5;
        uVar7 = (uint)uVar10;
        if (0xff < uVar11 - 7) break;
        bVar1 = *puVar12;
        uVar6 = uVar5;
        if (bVar1 != 0) {
          if ((bVar1 & bVar1 - 1) == 0) {
            if (bVar1 == 0x80) {
              uVar6 = (ulong)uVar11;
            }
            else {
              uVar6 = (ulong)uVar14;
              if (bVar1 == 4) {
                uVar6 = (ulong)(uVar14 | 2);
              }
              else if (bVar1 == 8) {
                uVar6 = (ulong)(uVar14 | 3);
              }
              else if (bVar1 == 0x10) {
                uVar6 = (ulong)(uVar14 | 4);
              }
              else if (bVar1 == 0x20) {
                uVar6 = (ulong)(uVar14 | 5);
              }
              else if (bVar1 == 0x40) {
                uVar6 = (ulong)(uVar14 | 6);
              }
              else if (bVar1 == 2) {
                uVar6 = (ulong)(uVar14 | 1);
              }
            }
            if ((uVar13 == 0) || ((uint)uVar6 < 0x80)) {
              if ((int)uVar4 < 0) goto LAB_0018ec1c;
              if (((int)uVar7 < 0) && (uVar10 = uVar6, uVar4 == re->tables[uVar6 + 0x100]))
              goto LAB_0018ec1f;
            }
          }
          uVar11 = re->flags;
          uVar14 = 0x40;
          goto LAB_0018ec3e;
        }
LAB_0018ec1c:
        uVar10 = uVar10 & 0xffffffff;
        uVar5 = uVar6;
LAB_0018ec1f:
        puVar12 = puVar12 + 1;
        uVar14 = uVar14 + 8;
        uVar11 = uVar11 + 8;
      }
      uVar11 = re->flags;
      uVar14 = 0x40;
      if ((-1 < (int)uVar4) &&
         ((-1 < (char)uVar11 ||
          ((re->last_codeunit != uVar4 && ((int)uVar7 < 0 || re->last_codeunit != uVar7)))))) {
        re->first_codeunit = uVar4;
        uVar14 = ~uVar7 >> 0x1a & 0xffffffe0 | 0x10;
      }
LAB_0018ec3e:
      uVar11 = uVar11 | uVar14;
      re->flags = uVar11;
    }
    else {
      if (iVar3 == 3) {
        return 1;
      }
      uVar11 = re->flags;
    }
  }
  iVar3 = 0;
  if (((uVar11 & 0x802000) == 0) && (re->top_backref < 0x81)) {
    depth = 0;
    iVar3 = 0;
    iVar2 = find_minlength(re,code,code,uVar13 >> 0x13,(recurse_check *)0x0,&count,&depth);
    if (iVar2 != -1) {
      if (iVar2 == -2) {
        iVar3 = 2;
      }
      else if (iVar2 == -3) {
        iVar3 = 3;
      }
      else {
        iVar8 = 0xffff;
        if (iVar2 < 0xffff) {
          iVar8 = iVar2;
        }
        re->minlength = (uint16_t)iVar8;
      }
    }
  }
  return iVar3;
}

Assistant:

int
PRIV(study)(pcre2_real_code *re)
{
int count = 0;
PCRE2_UCHAR *code;
BOOL utf = (re->overall_options & PCRE2_UTF) != 0;
BOOL ucp = (re->overall_options & PCRE2_UCP) != 0;

/* Find start of compiled code */

code = (PCRE2_UCHAR *)((uint8_t *)re + sizeof(pcre2_real_code)) +
  re->name_entry_size * re->name_count;

/* For a pattern that has a first code unit, or a multiline pattern that
matches only at "line start", there is no point in seeking a list of starting
code units. */

if ((re->flags & (PCRE2_FIRSTSET|PCRE2_STARTLINE)) == 0)
  {
  int depth = 0;
  int rc = set_start_bits(re, code, utf, ucp, &depth);
  if (rc == SSB_UNKNOWN) return 1;

  /* If a list of starting code units was set up, scan the list to see if only
  one or two were listed. Having only one listed is rare because usually a
  single starting code unit will have been recognized and PCRE2_FIRSTSET set.
  If two are listed, see if they are caseless versions of the same character;
  if so we can replace the list with a caseless first code unit. This gives
  better performance and is plausibly worth doing for patterns such as [Ww]ord
  or (word|WORD). */

  if (rc == SSB_DONE)
    {
    int i;
    int a = -1;
    int b = -1;
    uint8_t *p = re->start_bitmap;
    uint32_t flags = PCRE2_FIRSTMAPSET;

    for (i = 0; i < 256; p++, i += 8)
      {
      uint8_t x = *p;
      if (x != 0)
        {
        int c;
        uint8_t y = x & (~x + 1);   /* Least significant bit */
        if (y != x) goto DONE;      /* More than one bit set */

        /* In the 16-bit and 32-bit libraries, the bit for 0xff means "0xff and
        all wide characters", so we cannot use it here. */

#if PCRE2_CODE_UNIT_WIDTH != 8
        if (i == 248 && x == 0x80) goto DONE;
#endif

        /* Compute the character value */

        c = i;
        switch (x)
          {
          case 1:   break;
          case 2:   c += 1; break;  case 4:  c += 2; break;
          case 8:   c += 3; break;  case 16: c += 4; break;
          case 32:  c += 5; break;  case 64: c += 6; break;
          case 128: c += 7; break;
          }

        /* c contains the code unit value, in the range 0-255. In 8-bit UTF
        mode, only values < 128 can be used. In all the other cases, c is a
        character value. */

#if PCRE2_CODE_UNIT_WIDTH == 8
        if (utf && c > 127) goto DONE;
#endif
        if (a < 0) a = c;   /* First one found, save in a */
        else if (b < 0)     /* Second one found */
          {
          int d = TABLE_GET((unsigned int)c, re->tables + fcc_offset, c);

#ifdef SUPPORT_UNICODE
          if (utf || ucp)
            {
            if (UCD_CASESET(c) != 0) goto DONE;     /* Multiple case set */
            if (c > 127) d = UCD_OTHERCASE(c);
            }
#endif  /* SUPPORT_UNICODE */

          if (d != a) goto DONE;   /* Not the other case of a */
          b = c;                   /* Save second in b */
          }
        else goto DONE;   /* More than two characters found */
        }
      }

    /* Replace the start code unit bits with a first code unit, but only if it
    is not the same as a required later code unit. This is because a search for
    a required code unit starts after an explicit first code unit, but at a
    code unit found from the bitmap. Patterns such as /a*a/ don't work
    if both the start unit and required unit are the same. */

    if (a >= 0 &&
        (
        (re->flags & PCRE2_LASTSET) == 0 ||
          (
          re->last_codeunit != (uint32_t)a &&
          (b < 0 || re->last_codeunit != (uint32_t)b)
          )
        ))
      {
      re->first_codeunit = a;
      flags = PCRE2_FIRSTSET;
      if (b >= 0) flags |= PCRE2_FIRSTCASELESS;
      }

    DONE:
    re->flags |= flags;
    }
  }

/* Find the minimum length of subject string. If the pattern can match an empty
string, the minimum length is already known. If the pattern contains (*ACCEPT)
all bets are off, and we don't even try to find a minimum length. If there are
more back references than the size of the vector we are going to cache them in,
do nothing. A pattern that complicated will probably take a long time to
analyze and may in any case turn out to be too complicated. Note that back
reference minima are held as 16-bit numbers. */

if ((re->flags & (PCRE2_MATCH_EMPTY|PCRE2_HASACCEPT)) == 0 &&
     re->top_backref <= MAX_CACHE_BACKREF)
  {
  int min;
  int backref_cache[MAX_CACHE_BACKREF+1];
  backref_cache[0] = 0;    /* Highest one that is set */
  min = find_minlength(re, code, code, utf, NULL, &count, backref_cache);
  switch(min)
    {
    case -1:  /* \C in UTF mode or over-complex regex */
    break;    /* Leave minlength unchanged (will be zero) */

    case -2:
    return 2; /* missing capturing bracket */

    case -3:
    return 3; /* unrecognized opcode */

    default:
    re->minlength = (min > UINT16_MAX)? UINT16_MAX : min;
    break;
    }
  }

return 0;
}